

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void mzd_to_char_array(uint8_t *dst,mzd_local_t *data,size_t len)

{
  size_t __n;
  ulong uVar1;
  uint64_t tmp;
  undefined8 local_30;
  
  if (7 < len + 7) {
    uVar1 = len + 7 >> 3;
    do {
      local_30 = swap_bytes(data->w64[uVar1 - 1]);
      __n = 8;
      if (len < 8) {
        __n = len;
      }
      memcpy(dst,&local_30,__n);
      dst = dst + 8;
      len = len - 8;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void mzd_to_char_array(uint8_t* dst, const mzd_local_t* data, size_t len) {
  const size_t word_count = (len + 7) / sizeof(uint64_t);
  const block_t* block    = CONST_BLOCK(data, 0);

  for (size_t i = word_count; i; --i, dst += sizeof(uint64_t), len -= sizeof(uint64_t)) {
    const uint64_t tmp = htobe64(block->w64[i - 1]);
    memcpy(dst, &tmp, MIN(sizeof(tmp), len));
  }
}